

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::FindPsbtMap
               (wally_map *map_object,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
               string *field_name,size_t *index)

{
  uchar *key_00;
  CfdException *pCVar1;
  int ret;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t exist;
  
  exist = 0;
  key_00 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ret = wally_map_find(map_object,key_00,
                       (long)(key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)key_00,&exist);
  if (ret != 0) {
    local_60._0_8_ = "cfdcore_psbt.cpp";
    local_60._8_4_ = 0x357;
    local_60._16_8_ = "FindPsbtMap";
    logger::warn<int&>((CfdSourceLocation *)local_60,"wally_map_find NG[{}]",&ret);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+(&local_40,"psbt find ",field_name);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_40," error.");
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_60);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (exist == 0 || index != (size_t *)0x0) {
    if (index != (size_t *)0x0) {
      if (exist == 0) {
        local_60._0_8_ = "cfdcore_psbt.cpp";
        local_60._8_4_ = 0x361;
        local_60._16_8_ = "FindPsbtMap";
        logger::warn<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_60,"{} not found.",field_name);
        pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+(&local_40,"psbt ",field_name);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60,&local_40," not found error.");
        CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_60);
        __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
      }
      *index = exist - 1;
    }
    return;
  }
  local_60._0_8_ = "cfdcore_psbt.cpp";
  local_60._8_4_ = 0x35c;
  local_60._16_8_ = "FindPsbtMap";
  logger::warn<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_60,"{} duplicates.",field_name);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+(&local_40,"psbt ",field_name);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_40," duplicates error.");
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_60);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static void FindPsbtMap(
    const struct wally_map *map_object, const std::vector<uint8_t> &key,
    const std::string &field_name, size_t *index = nullptr) {
  size_t exist = 0;
  int ret = wally_map_find(map_object, key.data(), key.size(), &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(
        kCfdInternalError, "psbt find " + field_name + " error.");
  }
  if ((index == nullptr) && (exist != 0)) {
    warn(CFD_LOG_SOURCE, "{} duplicates.", field_name);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt " + field_name + " duplicates error.");
  } else if (index != nullptr) {
    if (exist == 0) {
      warn(CFD_LOG_SOURCE, "{} not found.", field_name);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt " + field_name + " not found error.");
    }
    *index = exist - 1;
  }
}